

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  int iVar7;
  undefined4 uVar8;
  float fVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  ulong unaff_R14;
  size_t mask;
  undefined1 auVar35 [16];
  bool bVar32;
  bool bVar33;
  ulong uVar34;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined8 local_1690;
  undefined8 uStack_1688;
  size_t local_1678;
  ulong local_1670;
  ulong *local_1668;
  Scene *local_1660;
  ulong local_1658;
  RTCFilterFunctionNArguments local_1650;
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined1 local_1570 [16];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  RTCHitN local_1490 [16];
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [16];
  undefined1 local_1430 [16];
  uint local_1420;
  uint uStack_141c;
  uint uStack_1418;
  uint uStack_1414;
  uint uStack_1410;
  uint uStack_140c;
  uint uStack_1408;
  uint uStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  char local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220;
  size_t local_1200;
  ulong local_11f8 [569];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar36 [16];
  
  local_1200 = root.ptr;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar88 = ZEXT3264(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar89 = ZEXT3264(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar90 = ZEXT3264(auVar37);
  fVar62 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar71 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar78 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar62 * 0.99999964)));
  auVar91 = ZEXT3264(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar71 * 0.99999964)));
  auVar92 = ZEXT3264(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar78 * 0.99999964)));
  auVar93 = ZEXT3264(auVar37);
  fVar62 = fVar62 * 1.0000004;
  fVar71 = fVar71 * 1.0000004;
  fVar78 = fVar78 * 1.0000004;
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1658 = uVar25 ^ 0x20;
  iVar7 = (tray->tnear).field_0.i[k];
  local_1600._4_4_ = iVar7;
  local_1600._0_4_ = iVar7;
  local_1600._8_4_ = iVar7;
  local_1600._12_4_ = iVar7;
  local_1600._16_4_ = iVar7;
  local_1600._20_4_ = iVar7;
  local_1600._24_4_ = iVar7;
  local_1600._28_4_ = iVar7;
  auVar86 = ZEXT3264(local_1600);
  iVar7 = (tray->tfar).field_0.i[k];
  local_1620._4_4_ = iVar7;
  local_1620._0_4_ = iVar7;
  local_1620._8_4_ = iVar7;
  local_1620._12_4_ = iVar7;
  local_1620._16_4_ = iVar7;
  local_1620._20_4_ = iVar7;
  local_1620._24_4_ = iVar7;
  local_1620._28_4_ = iVar7;
  auVar87 = ZEXT3264(local_1620);
  local_1570 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  puVar28 = local_11f8;
  fVar65 = fVar62;
  fVar66 = fVar62;
  fVar67 = fVar62;
  fVar68 = fVar62;
  fVar69 = fVar62;
  fVar70 = fVar62;
  fVar72 = fVar71;
  fVar73 = fVar71;
  fVar74 = fVar71;
  fVar75 = fVar71;
  fVar76 = fVar71;
  fVar77 = fVar71;
  fVar79 = fVar78;
  fVar80 = fVar78;
  fVar81 = fVar78;
  fVar82 = fVar78;
  fVar83 = fVar78;
  fVar84 = fVar78;
  local_15e0 = fVar78;
  fStack_15dc = fVar78;
  fStack_15d8 = fVar78;
  fStack_15d4 = fVar78;
  fStack_15d0 = fVar78;
  fStack_15cc = fVar78;
  fStack_15c8 = fVar78;
  fStack_15c4 = fVar78;
  local_15c0 = fVar71;
  fStack_15bc = fVar71;
  fStack_15b8 = fVar71;
  fStack_15b4 = fVar71;
  fStack_15b0 = fVar71;
  fStack_15ac = fVar71;
  fStack_15a8 = fVar71;
  fStack_15a4 = fVar71;
  local_15a0 = fVar62;
  fStack_159c = fVar62;
  fStack_1598 = fVar62;
  fStack_1594 = fVar62;
  fStack_1590 = fVar62;
  fStack_158c = fVar62;
  fStack_1588 = fVar62;
  fStack_1584 = fVar62;
  do {
    local_1668 = puVar28;
    if (local_1668 == &local_1200) break;
    puVar28 = local_1668 + -1;
    uVar27 = local_1668[-1];
    do {
      if ((uVar27 & 8) == 0) {
        auVar37 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + uVar29),auVar88._0_32_);
        auVar37 = vmulps_avx512vl(auVar91._0_32_,auVar37);
        auVar38 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + uVar30),auVar89._0_32_);
        auVar38 = vmulps_avx512vl(auVar92._0_32_,auVar38);
        auVar37 = vmaxps_avx(auVar37,auVar38);
        auVar38 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + uVar25),auVar90._0_32_);
        auVar38 = vmulps_avx512vl(auVar93._0_32_,auVar38);
        auVar38 = vmaxps_avx(auVar38,auVar86._0_32_);
        auVar37 = vmaxps_avx(auVar37,auVar38);
        auVar39 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + (uVar29 ^ 0x20)),
                                  auVar88._0_32_);
        auVar38._4_4_ = fVar65 * auVar39._4_4_;
        auVar38._0_4_ = fVar62 * auVar39._0_4_;
        auVar38._8_4_ = fVar66 * auVar39._8_4_;
        auVar38._12_4_ = fVar67 * auVar39._12_4_;
        auVar38._16_4_ = fVar68 * auVar39._16_4_;
        auVar38._20_4_ = fVar69 * auVar39._20_4_;
        auVar38._24_4_ = fVar70 * auVar39._24_4_;
        auVar38._28_4_ = auVar39._28_4_;
        auVar40 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + (uVar30 ^ 0x20)),
                                  auVar89._0_32_);
        auVar39._4_4_ = fVar72 * auVar40._4_4_;
        auVar39._0_4_ = fVar71 * auVar40._0_4_;
        auVar39._8_4_ = fVar73 * auVar40._8_4_;
        auVar39._12_4_ = fVar74 * auVar40._12_4_;
        auVar39._16_4_ = fVar75 * auVar40._16_4_;
        auVar39._20_4_ = fVar76 * auVar40._20_4_;
        auVar39._24_4_ = fVar77 * auVar40._24_4_;
        auVar39._28_4_ = auVar40._28_4_;
        auVar38 = vminps_avx(auVar38,auVar39);
        auVar39 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + local_1658),auVar90._0_32_)
        ;
        auVar40._4_4_ = fVar79 * auVar39._4_4_;
        auVar40._0_4_ = fVar78 * auVar39._0_4_;
        auVar40._8_4_ = fVar80 * auVar39._8_4_;
        auVar40._12_4_ = fVar81 * auVar39._12_4_;
        auVar40._16_4_ = fVar82 * auVar39._16_4_;
        auVar40._20_4_ = fVar83 * auVar39._20_4_;
        auVar40._24_4_ = fVar84 * auVar39._24_4_;
        auVar40._28_4_ = auVar39._28_4_;
        auVar39 = vminps_avx(auVar40,auVar87._0_32_);
        auVar38 = vminps_avx(auVar38,auVar39);
        uVar13 = vcmpps_avx512vl(auVar37,auVar38,2);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),(uint)(byte)uVar13);
      }
      if ((uVar27 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar31 = 4;
        }
        else {
          uVar26 = uVar27 & 0xfffffffffffffff0;
          lVar24 = 0;
          for (uVar27 = unaff_R14; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
            lVar24 = lVar24 + 1;
          }
          uVar31 = 0;
          for (uVar22 = unaff_R14 - 1 & unaff_R14; uVar27 = *(ulong *)(uVar26 + lVar24 * 8),
              uVar22 != 0; uVar22 = uVar22 - 1 & uVar22) {
            *puVar28 = uVar27;
            puVar28 = puVar28 + 1;
            lVar24 = 0;
            for (uVar27 = uVar22; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              lVar24 = lVar24 + 1;
            }
          }
        }
      }
      else {
        uVar31 = 6;
      }
    } while (uVar31 == 0);
    if (uVar31 == 6) {
      uVar31 = 0;
      local_1670 = (ulong)((uint)uVar27 & 0xf) - 8;
      bVar32 = local_1670 != 0;
      if (bVar32) {
        uVar27 = uVar27 & 0xfffffffffffffff0;
        uVar26 = 0;
        do {
          lVar23 = uVar26 * 0xe0;
          lVar24 = uVar27 + 0xd0 + lVar23;
          local_1400 = *(undefined8 *)(lVar24 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar24 + 0x18);
          lVar24 = uVar27 + 0xc0 + lVar23;
          local_13e0 = *(undefined8 *)(lVar24 + 0x10);
          uStack_13d8 = *(undefined8 *)(lVar24 + 0x18);
          uStack_13d0 = local_13e0;
          uStack_13c8 = uStack_13d8;
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          auVar37._16_16_ = *(undefined1 (*) [16])(uVar27 + 0x60 + lVar23);
          auVar37._0_16_ = *(undefined1 (*) [16])(uVar27 + lVar23);
          auVar41._16_16_ = *(undefined1 (*) [16])(uVar27 + 0x70 + lVar23);
          auVar41._0_16_ = *(undefined1 (*) [16])(uVar27 + 0x10 + lVar23);
          auVar45._16_16_ = *(undefined1 (*) [16])(uVar27 + 0x80 + lVar23);
          auVar45._0_16_ = *(undefined1 (*) [16])(uVar27 + 0x20 + lVar23);
          auVar35 = *(undefined1 (*) [16])(uVar27 + 0x30 + lVar23);
          auVar46._16_16_ = auVar35;
          auVar46._0_16_ = auVar35;
          auVar35 = *(undefined1 (*) [16])(uVar27 + 0x40 + lVar23);
          auVar47._16_16_ = auVar35;
          auVar47._0_16_ = auVar35;
          auVar35 = *(undefined1 (*) [16])(uVar27 + 0x50 + lVar23);
          auVar48._16_16_ = auVar35;
          auVar48._0_16_ = auVar35;
          auVar35 = *(undefined1 (*) [16])(uVar27 + 0x90 + lVar23);
          auVar49._16_16_ = auVar35;
          auVar49._0_16_ = auVar35;
          auVar35 = *(undefined1 (*) [16])(uVar27 + 0xa0 + lVar23);
          auVar50._16_16_ = auVar35;
          auVar50._0_16_ = auVar35;
          auVar35 = *(undefined1 (*) [16])(uVar27 + 0xb0 + lVar23);
          auVar51._16_16_ = auVar35;
          auVar51._0_16_ = auVar35;
          uVar8 = *(undefined4 *)(ray + k * 4);
          auVar52._4_4_ = uVar8;
          auVar52._0_4_ = uVar8;
          auVar52._8_4_ = uVar8;
          auVar52._12_4_ = uVar8;
          auVar52._16_4_ = uVar8;
          auVar52._20_4_ = uVar8;
          auVar52._24_4_ = uVar8;
          auVar52._28_4_ = uVar8;
          auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
          auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar60._4_4_ = uVar8;
          auVar60._0_4_ = uVar8;
          auVar60._8_4_ = uVar8;
          auVar60._12_4_ = uVar8;
          auVar60._16_4_ = uVar8;
          auVar60._20_4_ = uVar8;
          auVar60._24_4_ = uVar8;
          auVar60._28_4_ = uVar8;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar63._4_4_ = uVar8;
          auVar63._0_4_ = uVar8;
          auVar63._8_4_ = uVar8;
          auVar63._12_4_ = uVar8;
          auVar63._16_4_ = uVar8;
          auVar63._20_4_ = uVar8;
          auVar63._24_4_ = uVar8;
          auVar63._28_4_ = uVar8;
          fVar9 = *(float *)(ray + k * 4 + 0x60);
          auVar85._4_4_ = fVar9;
          auVar85._0_4_ = fVar9;
          auVar85._8_4_ = fVar9;
          auVar85._12_4_ = fVar9;
          auVar85._16_4_ = fVar9;
          auVar85._20_4_ = fVar9;
          auVar85._24_4_ = fVar9;
          auVar85._28_4_ = fVar9;
          auVar37 = vsubps_avx(auVar37,auVar52);
          auVar40 = vsubps_avx512vl(auVar41,auVar38);
          auVar41 = vsubps_avx512vl(auVar45,auVar39);
          auVar42 = vsubps_avx512vl(auVar46,auVar52);
          auVar43 = vsubps_avx512vl(auVar47,auVar38);
          auVar44 = vsubps_avx512vl(auVar48,auVar39);
          auVar45 = vsubps_avx512vl(auVar49,auVar52);
          auVar46 = vsubps_avx512vl(auVar50,auVar38);
          auVar39 = vsubps_avx512vl(auVar51,auVar39);
          auVar47 = vsubps_avx512vl(auVar45,auVar37);
          auVar48 = vsubps_avx512vl(auVar46,auVar40);
          auVar38 = vsubps_avx(auVar39,auVar41);
          auVar49 = vsubps_avx512vl(auVar37,auVar42);
          auVar50 = vsubps_avx512vl(auVar40,auVar43);
          auVar51 = vsubps_avx512vl(auVar41,auVar44);
          auVar52 = vsubps_avx512vl(auVar42,auVar45);
          auVar53 = vsubps_avx512vl(auVar43,auVar46);
          auVar54 = vsubps_avx512vl(auVar44,auVar39);
          auVar55 = vaddps_avx512vl(auVar45,auVar37);
          auVar56 = vaddps_avx512vl(auVar46,auVar40);
          auVar57 = vaddps_avx512vl(auVar39,auVar41);
          auVar58 = vmulps_avx512vl(auVar56,auVar38);
          auVar58 = vfmsub231ps_avx512vl(auVar58,auVar48,auVar57);
          auVar57 = vmulps_avx512vl(auVar57,auVar47);
          auVar59 = vfmsub231ps_avx512vl(auVar57,auVar38,auVar55);
          auVar57._4_4_ = auVar48._4_4_ * auVar55._4_4_;
          auVar57._0_4_ = auVar48._0_4_ * auVar55._0_4_;
          auVar57._8_4_ = auVar48._8_4_ * auVar55._8_4_;
          auVar57._12_4_ = auVar48._12_4_ * auVar55._12_4_;
          auVar57._16_4_ = auVar48._16_4_ * auVar55._16_4_;
          auVar57._20_4_ = auVar48._20_4_ * auVar55._20_4_;
          auVar57._24_4_ = auVar48._24_4_ * auVar55._24_4_;
          auVar57._28_4_ = auVar55._28_4_;
          auVar35 = vfmsub231ps_fma(auVar57,auVar47,auVar56);
          auVar56._0_4_ = fVar9 * auVar35._0_4_;
          auVar56._4_4_ = fVar9 * auVar35._4_4_;
          auVar56._8_4_ = fVar9 * auVar35._8_4_;
          auVar56._12_4_ = fVar9 * auVar35._12_4_;
          auVar56._16_4_ = fVar9 * 0.0;
          auVar56._20_4_ = fVar9 * 0.0;
          auVar56._24_4_ = fVar9 * 0.0;
          auVar56._28_4_ = 0;
          auVar57 = vfmadd231ps_avx512vl(auVar56,auVar63,auVar59);
          local_13c0 = vfmadd231ps_avx512vl(auVar57,auVar60,auVar58);
          auVar57 = vaddps_avx512vl(auVar37,auVar42);
          auVar55 = vaddps_avx512vl(auVar40,auVar43);
          auVar56 = vaddps_avx512vl(auVar41,auVar44);
          auVar58 = vmulps_avx512vl(auVar55,auVar51);
          auVar58 = vfmsub231ps_avx512vl(auVar58,auVar50,auVar56);
          auVar56 = vmulps_avx512vl(auVar56,auVar49);
          auVar56 = vfmsub231ps_avx512vl(auVar56,auVar51,auVar57);
          auVar57 = vmulps_avx512vl(auVar57,auVar50);
          auVar57 = vfmsub231ps_avx512vl(auVar57,auVar49,auVar55);
          auVar55._4_4_ = auVar57._4_4_ * fVar9;
          auVar55._0_4_ = auVar57._0_4_ * fVar9;
          auVar55._8_4_ = auVar57._8_4_ * fVar9;
          auVar55._12_4_ = auVar57._12_4_ * fVar9;
          auVar55._16_4_ = auVar57._16_4_ * fVar9;
          auVar55._20_4_ = auVar57._20_4_ * fVar9;
          auVar55._24_4_ = auVar57._24_4_ * fVar9;
          auVar55._28_4_ = auVar57._28_4_;
          auVar57 = vfmadd231ps_avx512vl(auVar55,auVar63,auVar56);
          local_13a0 = vfmadd231ps_avx512vl(auVar57,auVar60,auVar58);
          auVar42 = vaddps_avx512vl(auVar42,auVar45);
          auVar43 = vaddps_avx512vl(auVar43,auVar46);
          auVar39 = vaddps_avx512vl(auVar44,auVar39);
          auVar57 = vmulps_avx512vl(auVar43,auVar54);
          auVar57 = vfmsub231ps_avx512vl(auVar57,auVar53,auVar39);
          auVar44._4_4_ = auVar39._4_4_ * auVar52._4_4_;
          auVar44._0_4_ = auVar39._0_4_ * auVar52._0_4_;
          auVar44._8_4_ = auVar39._8_4_ * auVar52._8_4_;
          auVar44._12_4_ = auVar39._12_4_ * auVar52._12_4_;
          auVar44._16_4_ = auVar39._16_4_ * auVar52._16_4_;
          auVar44._20_4_ = auVar39._20_4_ * auVar52._20_4_;
          auVar44._24_4_ = auVar39._24_4_ * auVar52._24_4_;
          auVar44._28_4_ = auVar39._28_4_;
          auVar39 = vfmsub231ps_avx512vl(auVar44,auVar54,auVar42);
          auVar42 = vmulps_avx512vl(auVar42,auVar53);
          auVar42 = vfmsub231ps_avx512vl(auVar42,auVar52,auVar43);
          auVar42 = vmulps_avx512vl(auVar42,auVar85);
          auVar39 = vfmadd231ps_avx512vl(auVar42,auVar63,auVar39);
          auVar39 = vfmadd231ps_avx512vl(auVar39,auVar60,auVar57);
          auVar58._0_4_ = local_13a0._0_4_ + local_13c0._0_4_;
          auVar58._4_4_ = local_13a0._4_4_ + local_13c0._4_4_;
          auVar58._8_4_ = local_13a0._8_4_ + local_13c0._8_4_;
          auVar58._12_4_ = local_13a0._12_4_ + local_13c0._12_4_;
          auVar58._16_4_ = local_13a0._16_4_ + local_13c0._16_4_;
          auVar58._20_4_ = local_13a0._20_4_ + local_13c0._20_4_;
          auVar58._24_4_ = local_13a0._24_4_ + local_13c0._24_4_;
          auVar58._28_4_ = local_13a0._28_4_ + local_13c0._28_4_;
          local_1380 = vaddps_avx512vl(auVar39,auVar58);
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(local_1380,auVar57);
          auVar42._8_4_ = 0x34000000;
          auVar42._0_8_ = 0x3400000034000000;
          auVar42._12_4_ = 0x34000000;
          auVar42._16_4_ = 0x34000000;
          auVar42._20_4_ = 0x34000000;
          auVar42._24_4_ = 0x34000000;
          auVar42._28_4_ = 0x34000000;
          auVar42 = vmulps_avx512vl(auVar57,auVar42);
          auVar43 = vminps_avx512vl(local_13c0,local_13a0);
          auVar55 = vminps_avx512vl(auVar43,auVar39);
          auVar43._8_4_ = 0x80000000;
          auVar43._0_8_ = 0x8000000080000000;
          auVar43._12_4_ = 0x80000000;
          auVar43._16_4_ = 0x80000000;
          auVar43._20_4_ = 0x80000000;
          auVar43._24_4_ = 0x80000000;
          auVar43._28_4_ = 0x80000000;
          auVar43 = vxorps_avx512vl(auVar42,auVar43);
          uVar13 = vcmpps_avx512vl(auVar55,auVar43,5);
          auVar43 = vmaxps_avx512vl(local_13c0,local_13a0);
          auVar39 = vmaxps_avx512vl(auVar43,auVar39);
          uVar14 = vcmpps_avx512vl(auVar39,auVar42,2);
          bVar16 = (byte)uVar13 | (byte)uVar14;
          fVar65 = fStack_159c;
          fVar66 = fStack_1598;
          fVar67 = fStack_1594;
          fVar68 = fStack_1590;
          fVar69 = fStack_158c;
          fVar70 = fStack_1588;
          fVar62 = local_15a0;
          fVar72 = fStack_15bc;
          fVar73 = fStack_15b8;
          fVar74 = fStack_15b4;
          fVar75 = fStack_15b0;
          fVar76 = fStack_15ac;
          fVar77 = fStack_15a8;
          fVar71 = local_15c0;
          fVar79 = fStack_15dc;
          fVar80 = fStack_15d8;
          fVar81 = fStack_15d4;
          fVar82 = fStack_15d0;
          fVar83 = fStack_15cc;
          fVar84 = fStack_15c8;
          fVar78 = local_15e0;
          if (bVar16 == 0) {
LAB_00854ab8:
            auVar86 = ZEXT3264(local_1600);
            auVar87 = ZEXT3264(local_1620);
          }
          else {
            auVar39 = vmulps_avx512vl(auVar50,auVar38);
            auVar42 = vmulps_avx512vl(auVar47,auVar51);
            auVar43 = vmulps_avx512vl(auVar49,auVar48);
            auVar55 = vmulps_avx512vl(auVar53,auVar51);
            auVar44 = vmulps_avx512vl(auVar49,auVar54);
            auVar45 = vmulps_avx512vl(auVar52,auVar50);
            auVar46 = vfmsub213ps_avx512vl(auVar48,auVar51,auVar39);
            auVar38 = vfmsub213ps_avx512vl(auVar38,auVar49,auVar42);
            auVar47 = vfmsub213ps_avx512vl(auVar47,auVar50,auVar43);
            auVar48 = vfmsub213ps_avx512vl(auVar54,auVar50,auVar55);
            auVar50 = vfmsub213ps_avx512vl(auVar52,auVar51,auVar44);
            auVar49 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar45);
            vandps_avx512vl(auVar39,auVar57);
            vandps_avx512vl(auVar55,auVar57);
            uVar22 = vcmpps_avx512vl(auVar49,auVar49,1);
            vandps_avx512vl(auVar42,auVar57);
            vandps_avx512vl(auVar44,auVar57);
            uVar15 = vcmpps_avx512vl(auVar49,auVar49,1);
            vandps_avx512vl(auVar43,auVar57);
            vandps_avx512vl(auVar45,auVar57);
            uVar34 = vcmpps_avx512vl(auVar49,auVar49,1);
            bVar33 = (bool)((byte)uVar22 & 1);
            local_1360._0_4_ = (float)((uint)bVar33 * auVar46._0_4_ | (uint)!bVar33 * auVar48._0_4_)
            ;
            bVar33 = (bool)((byte)(uVar22 >> 1) & 1);
            local_1360._4_4_ = (float)((uint)bVar33 * auVar46._4_4_ | (uint)!bVar33 * auVar48._4_4_)
            ;
            bVar33 = (bool)((byte)(uVar22 >> 2) & 1);
            local_1360._8_4_ = (float)((uint)bVar33 * auVar46._8_4_ | (uint)!bVar33 * auVar48._8_4_)
            ;
            bVar33 = (bool)((byte)(uVar22 >> 3) & 1);
            local_1360._12_4_ =
                 (float)((uint)bVar33 * auVar46._12_4_ | (uint)!bVar33 * auVar48._12_4_);
            bVar33 = (bool)((byte)(uVar22 >> 4) & 1);
            local_1360._16_4_ =
                 (float)((uint)bVar33 * auVar46._16_4_ | (uint)!bVar33 * auVar48._16_4_);
            bVar33 = (bool)((byte)(uVar22 >> 5) & 1);
            local_1360._20_4_ =
                 (float)((uint)bVar33 * auVar46._20_4_ | (uint)!bVar33 * auVar48._20_4_);
            bVar33 = (bool)((byte)(uVar22 >> 6) & 1);
            local_1360._24_4_ =
                 (float)((uint)bVar33 * auVar46._24_4_ | (uint)!bVar33 * auVar48._24_4_);
            bVar33 = SUB81(uVar22 >> 7,0);
            local_1360._28_4_ = (uint)bVar33 * auVar46._28_4_ | (uint)!bVar33 * auVar48._28_4_;
            bVar33 = (bool)((byte)uVar15 & 1);
            local_1340._0_4_ = (float)((uint)bVar33 * auVar38._0_4_ | (uint)!bVar33 * auVar50._0_4_)
            ;
            bVar33 = (bool)((byte)(uVar15 >> 1) & 1);
            local_1340._4_4_ = (float)((uint)bVar33 * auVar38._4_4_ | (uint)!bVar33 * auVar50._4_4_)
            ;
            bVar33 = (bool)((byte)(uVar15 >> 2) & 1);
            local_1340._8_4_ = (float)((uint)bVar33 * auVar38._8_4_ | (uint)!bVar33 * auVar50._8_4_)
            ;
            bVar33 = (bool)((byte)(uVar15 >> 3) & 1);
            local_1340._12_4_ =
                 (float)((uint)bVar33 * auVar38._12_4_ | (uint)!bVar33 * auVar50._12_4_);
            bVar33 = (bool)((byte)(uVar15 >> 4) & 1);
            local_1340._16_4_ =
                 (float)((uint)bVar33 * auVar38._16_4_ | (uint)!bVar33 * auVar50._16_4_);
            bVar33 = (bool)((byte)(uVar15 >> 5) & 1);
            local_1340._20_4_ =
                 (float)((uint)bVar33 * auVar38._20_4_ | (uint)!bVar33 * auVar50._20_4_);
            bVar33 = (bool)((byte)(uVar15 >> 6) & 1);
            local_1340._24_4_ =
                 (float)((uint)bVar33 * auVar38._24_4_ | (uint)!bVar33 * auVar50._24_4_);
            bVar33 = SUB81(uVar15 >> 7,0);
            local_1340._28_4_ = (uint)bVar33 * auVar38._28_4_ | (uint)!bVar33 * auVar50._28_4_;
            bVar33 = (bool)((byte)uVar34 & 1);
            local_1320._0_4_ = (float)((uint)bVar33 * auVar47._0_4_ | (uint)!bVar33 * auVar49._0_4_)
            ;
            bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
            local_1320._4_4_ = (float)((uint)bVar33 * auVar47._4_4_ | (uint)!bVar33 * auVar49._4_4_)
            ;
            bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
            local_1320._8_4_ = (float)((uint)bVar33 * auVar47._8_4_ | (uint)!bVar33 * auVar49._8_4_)
            ;
            bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
            local_1320._12_4_ =
                 (float)((uint)bVar33 * auVar47._12_4_ | (uint)!bVar33 * auVar49._12_4_);
            bVar33 = (bool)((byte)(uVar34 >> 4) & 1);
            local_1320._16_4_ =
                 (float)((uint)bVar33 * auVar47._16_4_ | (uint)!bVar33 * auVar49._16_4_);
            bVar33 = (bool)((byte)(uVar34 >> 5) & 1);
            local_1320._20_4_ =
                 (float)((uint)bVar33 * auVar47._20_4_ | (uint)!bVar33 * auVar49._20_4_);
            bVar33 = (bool)((byte)(uVar34 >> 6) & 1);
            local_1320._24_4_ =
                 (float)((uint)bVar33 * auVar47._24_4_ | (uint)!bVar33 * auVar49._24_4_);
            bVar33 = SUB81(uVar34 >> 7,0);
            local_1320._28_4_ = (uint)bVar33 * auVar47._28_4_ | (uint)!bVar33 * auVar49._28_4_;
            auVar19._4_4_ = fVar9 * local_1320._4_4_;
            auVar19._0_4_ = fVar9 * local_1320._0_4_;
            auVar19._8_4_ = fVar9 * local_1320._8_4_;
            auVar19._12_4_ = fVar9 * local_1320._12_4_;
            auVar19._16_4_ = fVar9 * local_1320._16_4_;
            auVar19._20_4_ = fVar9 * local_1320._20_4_;
            auVar19._24_4_ = fVar9 * local_1320._24_4_;
            auVar19._28_4_ = fVar9;
            auVar35 = vfmadd213ps_fma(auVar63,local_1340,auVar19);
            auVar35 = vfmadd213ps_fma(auVar60,local_1360,ZEXT1632(auVar35));
            auVar39 = ZEXT1632(CONCAT412(auVar35._12_4_ + auVar35._12_4_,
                                         CONCAT48(auVar35._8_4_ + auVar35._8_4_,
                                                  CONCAT44(auVar35._4_4_ + auVar35._4_4_,
                                                           auVar35._0_4_ + auVar35._0_4_))));
            auVar64._0_4_ = auVar41._0_4_ * local_1320._0_4_;
            auVar64._4_4_ = auVar41._4_4_ * local_1320._4_4_;
            auVar64._8_4_ = auVar41._8_4_ * local_1320._8_4_;
            auVar64._12_4_ = auVar41._12_4_ * local_1320._12_4_;
            auVar64._16_4_ = auVar41._16_4_ * local_1320._16_4_;
            auVar64._20_4_ = auVar41._20_4_ * local_1320._20_4_;
            auVar64._24_4_ = auVar41._24_4_ * local_1320._24_4_;
            auVar64._28_4_ = 0;
            auVar35 = vfmadd213ps_fma(auVar40,local_1340,auVar64);
            auVar17 = vfmadd213ps_fma(auVar37,local_1360,ZEXT1632(auVar35));
            auVar37 = vrcp14ps_avx512vl(auVar39);
            auVar53._8_4_ = 0x3f800000;
            auVar53._0_8_ = &DAT_3f8000003f800000;
            auVar53._12_4_ = 0x3f800000;
            auVar53._16_4_ = 0x3f800000;
            auVar53._20_4_ = 0x3f800000;
            auVar53._24_4_ = 0x3f800000;
            auVar53._28_4_ = 0x3f800000;
            auVar38 = vfnmadd213ps_avx512vl(auVar37,auVar39,auVar53);
            auVar35 = vfmadd132ps_fma(auVar38,auVar37,auVar37);
            local_12a0 = ZEXT1632(CONCAT412((auVar17._12_4_ + auVar17._12_4_) * auVar35._12_4_,
                                            CONCAT48((auVar17._8_4_ + auVar17._8_4_) * auVar35._8_4_
                                                     ,CONCAT44((auVar17._4_4_ + auVar17._4_4_) *
                                                               auVar35._4_4_,
                                                               (auVar17._0_4_ + auVar17._0_4_) *
                                                               auVar35._0_4_))));
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar54._4_4_ = uVar8;
            auVar54._0_4_ = uVar8;
            auVar54._8_4_ = uVar8;
            auVar54._12_4_ = uVar8;
            auVar54._16_4_ = uVar8;
            auVar54._20_4_ = uVar8;
            auVar54._24_4_ = uVar8;
            auVar54._28_4_ = uVar8;
            uVar13 = vcmpps_avx512vl(local_12a0,auVar54,0xd);
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar59._4_4_ = uVar8;
            auVar59._0_4_ = uVar8;
            auVar59._8_4_ = uVar8;
            auVar59._12_4_ = uVar8;
            auVar59._16_4_ = uVar8;
            auVar59._20_4_ = uVar8;
            auVar59._24_4_ = uVar8;
            auVar59._28_4_ = uVar8;
            uVar14 = vcmpps_avx512vl(local_12a0,auVar59,2);
            bVar16 = (byte)uVar13 & (byte)uVar14 & bVar16;
            if (bVar16 == 0) goto LAB_00854ab8;
            uVar22 = vcmpps_avx512vl(auVar39,_DAT_02020f00,4);
            uVar22 = bVar16 & uVar22;
            if ((char)uVar22 == '\0') goto LAB_00854ab8;
            local_1300 = (char)uVar22;
            local_1220 = 0xf0;
            local_1660 = context->scene;
            auVar18._8_4_ = 0x219392ef;
            auVar18._0_8_ = 0x219392ef219392ef;
            auVar18._12_4_ = 0x219392ef;
            auVar18._16_4_ = 0x219392ef;
            auVar18._20_4_ = 0x219392ef;
            auVar18._24_4_ = 0x219392ef;
            auVar18._28_4_ = 0x219392ef;
            uVar15 = vcmpps_avx512vl(auVar57,auVar18,5);
            auVar38 = vrcp14ps_avx512vl(local_1380);
            auVar61._8_4_ = 0x3f800000;
            auVar61._0_8_ = &DAT_3f8000003f800000;
            auVar61._12_4_ = 0x3f800000;
            auVar61._16_4_ = 0x3f800000;
            auVar61._20_4_ = 0x3f800000;
            auVar61._24_4_ = 0x3f800000;
            auVar61._28_4_ = 0x3f800000;
            auVar35 = vfnmadd213ps_fma(local_1380,auVar38,auVar61);
            auVar37 = vfmadd132ps_avx512vl(ZEXT1632(auVar35),auVar38,auVar38);
            fVar1 = (float)((uint)((byte)uVar15 & 1) * auVar37._0_4_);
            fVar2 = (float)((uint)((byte)(uVar15 >> 1) & 1) * auVar37._4_4_);
            fVar3 = (float)((uint)((byte)(uVar15 >> 2) & 1) * auVar37._8_4_);
            fVar4 = (float)((uint)((byte)(uVar15 >> 3) & 1) * auVar37._12_4_);
            fVar5 = (float)((uint)((byte)(uVar15 >> 4) & 1) * auVar37._16_4_);
            fVar6 = (float)((uint)((byte)(uVar15 >> 5) & 1) * auVar37._20_4_);
            fVar9 = (float)((uint)((byte)(uVar15 >> 6) & 1) * auVar37._24_4_);
            auVar20._4_4_ = fVar2 * local_13c0._4_4_;
            auVar20._0_4_ = fVar1 * local_13c0._0_4_;
            auVar20._8_4_ = fVar3 * local_13c0._8_4_;
            auVar20._12_4_ = fVar4 * local_13c0._12_4_;
            auVar20._16_4_ = fVar5 * local_13c0._16_4_;
            auVar20._20_4_ = fVar6 * local_13c0._20_4_;
            auVar20._24_4_ = fVar9 * local_13c0._24_4_;
            auVar20._28_4_ = local_13c0._28_4_;
            auVar37 = vminps_avx(auVar20,auVar61);
            auVar21._4_4_ = local_13a0._4_4_ * fVar2;
            auVar21._0_4_ = local_13a0._0_4_ * fVar1;
            auVar21._8_4_ = local_13a0._8_4_ * fVar3;
            auVar21._12_4_ = local_13a0._12_4_ * fVar4;
            auVar21._16_4_ = local_13a0._16_4_ * fVar5;
            auVar21._20_4_ = local_13a0._20_4_ * fVar6;
            auVar21._24_4_ = local_13a0._24_4_ * fVar9;
            auVar21._28_4_ = auVar38._28_4_;
            auVar38 = vminps_avx(auVar21,auVar61);
            auVar39 = vsubps_avx(auVar61,auVar37);
            auVar40 = vsubps_avx(auVar61,auVar38);
            local_12c0 = vblendps_avx(auVar38,auVar39,0xf0);
            local_12e0 = vblendps_avx(auVar37,auVar40,0xf0);
            fVar9 = (float)DAT_02060940;
            fVar6 = DAT_02060940._4_4_;
            local_1280._4_4_ = local_1360._4_4_ * fVar6;
            local_1280._0_4_ = local_1360._0_4_ * fVar9;
            fVar5 = DAT_02060940._8_4_;
            local_1280._8_4_ = local_1360._8_4_ * fVar5;
            fVar4 = DAT_02060940._12_4_;
            local_1280._12_4_ = local_1360._12_4_ * fVar4;
            fVar3 = DAT_02060940._16_4_;
            local_1280._16_4_ = local_1360._16_4_ * fVar3;
            fVar2 = DAT_02060940._20_4_;
            local_1280._20_4_ = local_1360._20_4_ * fVar2;
            fVar1 = DAT_02060940._24_4_;
            local_1280._24_4_ = local_1360._24_4_ * fVar1;
            local_1280._28_4_ = local_1360._28_4_;
            local_1260._4_4_ = local_1340._4_4_ * fVar6;
            local_1260._0_4_ = local_1340._0_4_ * fVar9;
            local_1260._8_4_ = local_1340._8_4_ * fVar5;
            local_1260._12_4_ = local_1340._12_4_ * fVar4;
            local_1260._16_4_ = local_1340._16_4_ * fVar3;
            local_1260._20_4_ = local_1340._20_4_ * fVar2;
            local_1260._24_4_ = local_1340._24_4_ * fVar1;
            local_1260._28_4_ = local_1340._28_4_;
            local_1240._4_4_ = local_1320._4_4_ * fVar6;
            local_1240._0_4_ = local_1320._0_4_ * fVar9;
            local_1240._8_4_ = local_1320._8_4_ * fVar5;
            local_1240._12_4_ = local_1320._12_4_ * fVar4;
            local_1240._16_4_ = local_1320._16_4_ * fVar3;
            local_1240._20_4_ = local_1320._20_4_ * fVar2;
            local_1240._24_4_ = local_1320._24_4_ * fVar1;
            local_1240._28_4_ = local_1320._28_4_;
            auVar86 = ZEXT3264(local_1600);
            auVar87 = ZEXT3264(local_1620);
            do {
              local_14c0 = auVar88._0_32_;
              uVar15 = 0;
              for (uVar34 = uVar22; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                uVar15 = uVar15 + 1;
              }
              pGVar11 = (local_1660->geometries).items[*(uint *)((long)&local_13e0 + uVar15 * 4)].
                        ptr;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar22 = uVar22 ^ 1L << (uVar15 & 0x3f);
                bVar33 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                bVar33 = false;
              }
              else {
                uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
                uVar34 = (ulong)(uint)((int)uVar15 * 4);
                uVar10 = *(undefined4 *)(local_12e0 + uVar34);
                local_1460._4_4_ = uVar10;
                local_1460._0_4_ = uVar10;
                local_1460._8_4_ = uVar10;
                local_1460._12_4_ = uVar10;
                uVar10 = *(undefined4 *)(local_12c0 + uVar34);
                local_1450._4_4_ = uVar10;
                local_1450._0_4_ = uVar10;
                local_1450._8_4_ = uVar10;
                local_1450._12_4_ = uVar10;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar34);
                local_1650.context = context->user;
                local_1430 = vpbroadcastd_avx512vl();
                uVar10 = *(undefined4 *)((long)&local_1400 + uVar34);
                local_1440._4_4_ = uVar10;
                local_1440._0_4_ = uVar10;
                local_1440._8_4_ = uVar10;
                local_1440._12_4_ = uVar10;
                uVar10 = *(undefined4 *)(local_1280 + uVar34);
                local_1490._4_4_ = uVar10;
                local_1490._0_4_ = uVar10;
                local_1490._8_4_ = uVar10;
                local_1490._12_4_ = uVar10;
                uVar10 = *(undefined4 *)(local_1260 + uVar34);
                local_1480._4_4_ = uVar10;
                local_1480._0_4_ = uVar10;
                local_1480._8_4_ = uVar10;
                local_1480._12_4_ = uVar10;
                uVar10 = *(undefined4 *)(local_1240 + uVar34);
                local_1470._4_4_ = uVar10;
                local_1470._0_4_ = uVar10;
                local_1470._8_4_ = uVar10;
                local_1470._12_4_ = uVar10;
                vpcmpeqd_avx2(ZEXT1632(local_1430),ZEXT1632(local_1430));
                uStack_141c = (local_1650.context)->instID[0];
                local_1420 = uStack_141c;
                uStack_1418 = uStack_141c;
                uStack_1414 = uStack_141c;
                uStack_1410 = (local_1650.context)->instPrimID[0];
                uStack_140c = uStack_1410;
                uStack_1408 = uStack_1410;
                uStack_1404 = uStack_1410;
                local_1690 = local_1570._0_8_;
                uStack_1688 = local_1570._8_8_;
                local_1650.valid = (int *)&local_1690;
                local_1650.geometryUserPtr = pGVar11->userPtr;
                local_1650.hit = local_1490;
                local_1650.N = 4;
                local_14e0 = auVar89._0_32_;
                local_1500 = auVar90._0_32_;
                local_1520 = auVar91._0_32_;
                local_1540 = auVar92._0_32_;
                local_1560 = auVar93._0_32_;
                local_1650.ray = (RTCRayN *)ray;
                if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  local_1678 = k;
                  (*pGVar11->occlusionFilterN)(&local_1650);
                  auVar87 = ZEXT3264(local_1620);
                  auVar86 = ZEXT3264(local_1600);
                  auVar93 = ZEXT3264(local_1560);
                  auVar92 = ZEXT3264(local_1540);
                  auVar91 = ZEXT3264(local_1520);
                  auVar90 = ZEXT3264(local_1500);
                  auVar89 = ZEXT3264(local_14e0);
                  auVar88 = ZEXT3264(local_14c0);
                  k = local_1678;
                  fVar62 = local_15a0;
                  fVar65 = fStack_159c;
                  fVar66 = fStack_1598;
                  fVar67 = fStack_1594;
                  fVar68 = fStack_1590;
                  fVar69 = fStack_158c;
                  fVar70 = fStack_1588;
                  fVar71 = local_15c0;
                  fVar72 = fStack_15bc;
                  fVar73 = fStack_15b8;
                  fVar74 = fStack_15b4;
                  fVar75 = fStack_15b0;
                  fVar76 = fStack_15ac;
                  fVar77 = fStack_15a8;
                  fVar78 = local_15e0;
                  fVar79 = fStack_15dc;
                  fVar80 = fStack_15d8;
                  fVar81 = fStack_15d4;
                  fVar82 = fStack_15d0;
                  fVar83 = fStack_15cc;
                  fVar84 = fStack_15c8;
                }
                auVar35._8_8_ = uStack_1688;
                auVar35._0_8_ = local_1690;
                uVar34 = vptestmd_avx512vl(auVar35,auVar35);
                if ((uVar34 & 0xf) == 0) {
                  bVar33 = true;
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var12)(&local_1650);
                    auVar87 = ZEXT3264(local_1620);
                    auVar86 = ZEXT3264(local_1600);
                    auVar93 = ZEXT3264(local_1560);
                    auVar92 = ZEXT3264(local_1540);
                    auVar91 = ZEXT3264(local_1520);
                    auVar90 = ZEXT3264(local_1500);
                    auVar89 = ZEXT3264(local_14e0);
                    auVar88 = ZEXT3264(local_14c0);
                    fVar62 = local_15a0;
                    fVar65 = fStack_159c;
                    fVar66 = fStack_1598;
                    fVar67 = fStack_1594;
                    fVar68 = fStack_1590;
                    fVar69 = fStack_158c;
                    fVar70 = fStack_1588;
                    fVar71 = local_15c0;
                    fVar72 = fStack_15bc;
                    fVar73 = fStack_15b8;
                    fVar74 = fStack_15b4;
                    fVar75 = fStack_15b0;
                    fVar76 = fStack_15ac;
                    fVar77 = fStack_15a8;
                    fVar78 = local_15e0;
                    fVar79 = fStack_15dc;
                    fVar80 = fStack_15d8;
                    fVar81 = fStack_15d4;
                    fVar82 = fStack_15d0;
                    fVar83 = fStack_15cc;
                    fVar84 = fStack_15c8;
                  }
                  auVar17._8_8_ = uStack_1688;
                  auVar17._0_8_ = local_1690;
                  uVar34 = vptestmd_avx512vl(auVar17,auVar17);
                  uVar34 = uVar34 & 0xf;
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar33 = (bool)((byte)uVar34 & 1);
                  auVar36._0_4_ =
                       (uint)bVar33 * auVar35._0_4_ |
                       (uint)!bVar33 * *(int *)(local_1650.ray + 0x80);
                  bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
                  auVar36._4_4_ =
                       (uint)bVar33 * auVar35._4_4_ |
                       (uint)!bVar33 * *(int *)(local_1650.ray + 0x84);
                  bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
                  auVar36._8_4_ =
                       (uint)bVar33 * auVar35._8_4_ |
                       (uint)!bVar33 * *(int *)(local_1650.ray + 0x88);
                  bVar33 = SUB81(uVar34 >> 3,0);
                  auVar36._12_4_ =
                       (uint)bVar33 * auVar35._12_4_ |
                       (uint)!bVar33 * *(int *)(local_1650.ray + 0x8c);
                  *(undefined1 (*) [16])(local_1650.ray + 0x80) = auVar36;
                  bVar33 = (byte)uVar34 == 0;
                }
                if (bVar33) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar8;
                  uVar22 = uVar22 ^ 1L << (uVar15 & 0x3f);
                }
              }
              uVar31 = 0;
              if (!bVar33) {
                if (bVar32) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  uVar31 = 1;
                }
                goto LAB_00854b08;
              }
            } while (uVar22 != 0);
          }
          uVar31 = 0;
          uVar26 = uVar26 + 1;
          bVar32 = uVar26 < local_1670;
        } while (uVar26 != local_1670);
      }
    }
LAB_00854b08:
  } while ((uVar31 & 3) == 0);
  return local_1668 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }